

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void __thiscall QWhatsThat::mouseMoveEvent(QWhatsThat *this,QMouseEvent *e)

{
  ulong uVar1;
  CursorShape CVar2;
  long in_FS_OFFSET;
  double dVar3;
  double extraout_XMM1_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 local_58 [16];
  QPointF local_48;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->doc != (QTextDocument *)0x0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::documentLayout();
    dVar3 = (double)QEventPoint::position();
    auVar4._0_8_ = (double)(((ulong)dVar3 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) +
                   dVar3;
    auVar4._8_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar5 = maxpd(auVar4,_DAT_006605e0);
    uVar1 = -(ulong)(2147483647.0 < auVar4._8_8_) & 0x41dfffffffc00000;
    auVar6._0_8_ = ~-(ulong)(2147483647.0 < auVar4._0_8_) & auVar5._0_8_;
    auVar6._8_8_ = ~-(ulong)(2147483647.0 < auVar4._8_8_) & auVar5._8_8_;
    auVar5._8_4_ = (int)uVar1;
    auVar5._0_8_ = -(ulong)(2147483647.0 < auVar4._0_8_) & 0x41dfffffffc00000;
    auVar5._12_4_ = (int)(uVar1 >> 0x20);
    dVar3 = (double)((int)SUB168(auVar6 | auVar5,8) + -8);
    local_58._8_4_ = SUB84(dVar3,0);
    local_58._0_8_ = (double)((int)SUB168(auVar6 | auVar5,0) + -0xc);
    local_58._12_4_ = (int)((ulong)dVar3 >> 0x20);
    QAbstractTextDocumentLayout::anchorAt(&local_48);
    if (local_38 == (undefined1 *)0x0) {
      CVar2 = ArrowCursor;
    }
    else {
      CVar2 = PointingHandCursor;
    }
    QCursor::QCursor((QCursor *)local_58,CVar2);
    QWidget::setCursor(&this->super_QWidget,(QCursor *)local_58);
    QCursor::~QCursor((QCursor *)local_58);
    if ((QArrayData *)local_48.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48.xp,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseMoveEvent(QMouseEvent* e)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(e);
#else
    if (!doc)
        return;
    QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
    if (!a.isEmpty())
        setCursor(Qt::PointingHandCursor);
    else
        setCursor(Qt::ArrowCursor);
#endif
}